

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

ArrayPtr<const_kj::(anonymous_namespace)::HttpTestCase> kj::anon_unknown_0::pipelineTestCases(void)

{
  int iVar1;
  HeaderTestCase *pHVar2;
  ArrayPtr<const_kj::(anonymous_namespace)::HttpTestCase> AVar3;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_3a8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_388;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_368;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_348;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_328;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_308;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_2e8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_2c8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_2a8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_288;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_268;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_248;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_228;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_208;
  Array<kj::StringPtr> local_1e8;
  Array<kj::StringPtr> local_1c8;
  Array<kj::StringPtr> local_1a8;
  Array<kj::StringPtr> local_188;
  Array<kj::StringPtr> local_168;
  Array<kj::StringPtr> local_148;
  Array<kj::StringPtr> local_128;
  Array<kj::StringPtr> local_108;
  Array<kj::StringPtr> local_e8;
  Array<kj::StringPtr> local_c8;
  Array<kj::StringPtr> local_a8;
  Array<kj::StringPtr> local_88;
  Array<kj::StringPtr> local_68;
  Array<kj::StringPtr> local_48;
  
  if ((anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS);
    if (iVar1 != 0) {
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_228.size_ = 0;
      local_228.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_228.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[0].request.raw.content.ptr = "GET / HTTP/1.1\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[0].request.raw.content.size_ = 0x13;
      pipelineTestCases::PIPELINE_TESTS[0].request.method = GET;
      pipelineTestCases::PIPELINE_TESTS[0].request.path.content.ptr = "/";
      pipelineTestCases::PIPELINE_TESTS[0].request.path.content.size_ = 2;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_228.ptr = (HeaderTestCase *)0x0;
      local_228.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestBodySize.ptr.field_1.value = 0;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestBodyParts.super_Array<kj::StringPtr>.size_
           = 0;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_68.ptr = (StringPtr *)0x0;
      local_68.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[0].request.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[0].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_248.size_ = 0;
      local_248.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_248.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
           = (StringPtr *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((pipelineTestCases::PIPELINE_TESTS[0].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).ptr = "foo bar";
      ((pipelineTestCases::PIPELINE_TESTS[0].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).size_ = 8;
      local_88.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[0].response.raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: 7\r\n\r\nfoo bar";
      pipelineTestCases::PIPELINE_TESTS[0].response.raw.content.size_ = 0x2e;
      pipelineTestCases::PIPELINE_TESTS[0].response.statusCode = 200;
      pipelineTestCases::PIPELINE_TESTS[0].response.statusText.content.ptr = "OK";
      pipelineTestCases::PIPELINE_TESTS[0].response.statusText.content.size_ = 3;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_248.ptr = (HeaderTestCase *)0x0;
      local_248.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseBodySize.ptr.field_1.value = 7;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseBodyParts.super_Array<kj::StringPtr>.
      size_ = 1;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_88.ptr = (StringPtr *)0x0;
      local_88.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[0].response.method = GET;
      pipelineTestCases::PIPELINE_TESTS[0].response.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[0].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_268.size_ = 0;
      local_268.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_268.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((pipelineTestCases::PIPELINE_TESTS[1].request.requestBodyParts.super_Array<kj::StringPtr>.ptr
       )->content).ptr = "grault";
      ((pipelineTestCases::PIPELINE_TESTS[1].request.requestBodyParts.super_Array<kj::StringPtr>.ptr
       )->content).size_ = 7;
      local_a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[1].request.raw.content.ptr =
           "POST /foo HTTP/1.1\r\nContent-Length: 6\r\n\r\ngrault";
      pipelineTestCases::PIPELINE_TESTS[1].request.raw.content.size_ = 0x30;
      pipelineTestCases::PIPELINE_TESTS[1].request.method = POST;
      pipelineTestCases::PIPELINE_TESTS[1].request.path.content.ptr = "/foo";
      pipelineTestCases::PIPELINE_TESTS[1].request.path.content.size_ = 5;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_268.ptr = (HeaderTestCase *)0x0;
      local_268.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestBodySize.ptr.field_1.value = 6;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestBodyParts.super_Array<kj::StringPtr>.size_
           = 1;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_a8.ptr = (StringPtr *)0x0;
      local_a8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[1].request.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[1].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_288.size_ = 0;
      local_288.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_288.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
           = (StringPtr *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((pipelineTestCases::PIPELINE_TESTS[1].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).ptr = "baz qux corge";
      ((pipelineTestCases::PIPELINE_TESTS[1].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).size_ = 0xe;
      local_c8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[1].response.raw.content.ptr =
           "HTTP/1.1 404 Not Found\r\nContent-Length: 13\r\n\r\nbaz qux corge";
      pipelineTestCases::PIPELINE_TESTS[1].response.raw.content.size_ = 0x3c;
      pipelineTestCases::PIPELINE_TESTS[1].response.statusCode = 0x194;
      pipelineTestCases::PIPELINE_TESTS[1].response.statusText.content.ptr = "Not Found";
      pipelineTestCases::PIPELINE_TESTS[1].response.statusText.content.size_ = 10;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_288.ptr = (HeaderTestCase *)0x0;
      local_288.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseBodySize.ptr.field_1.value = 0xd;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseBodyParts.super_Array<kj::StringPtr>.
      size_ = 1;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_c8.ptr = (StringPtr *)0x0;
      local_c8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[1].response.method = GET;
      pipelineTestCases::PIPELINE_TESTS[1].response.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[1].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_2a8.size_ = 0;
      local_2a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_2a8.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_e8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[2].request.raw.content.ptr =
           "POST /foo HTTP/1.1\r\nContent-Length: 0\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[2].request.raw.content.size_ = 0x2a;
      pipelineTestCases::PIPELINE_TESTS[2].request.method = POST;
      pipelineTestCases::PIPELINE_TESTS[2].request.path.content.ptr = "/foo";
      pipelineTestCases::PIPELINE_TESTS[2].request.path.content.size_ = 5;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_2a8.ptr = (HeaderTestCase *)0x0;
      local_2a8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestBodySize.ptr.field_1.value = 0;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestBodyParts.super_Array<kj::StringPtr>.size_
           = 0;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_e8.ptr = (StringPtr *)0x0;
      local_e8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[2].request.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[2].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_2c8.size_ = 0;
      local_2c8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_2c8.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
           = (StringPtr *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_108.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[2].response.raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: 0\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[2].response.raw.content.size_ = 0x27;
      pipelineTestCases::PIPELINE_TESTS[2].response.statusCode = 200;
      pipelineTestCases::PIPELINE_TESTS[2].response.statusText.content.ptr = "OK";
      pipelineTestCases::PIPELINE_TESTS[2].response.statusText.content.size_ = 3;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_2c8.ptr = (HeaderTestCase *)0x0;
      local_2c8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseBodySize.ptr.field_1.value = 0;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseBodyParts.super_Array<kj::StringPtr>.
      size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_108.ptr = (StringPtr *)0x0;
      local_108.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[2].response.method = GET;
      pipelineTestCases::PIPELINE_TESTS[2].response.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[2].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_2e8.size_ = 0;
      local_2e8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_2e8.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[3].request.requestBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_128.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[3].request.raw.content.ptr =
           "POST /foo HTTP/1.1\r\nTransfer-Encoding: chunked\r\n\r\n0\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[3].request.raw.content.size_ = 0x38;
      pipelineTestCases::PIPELINE_TESTS[3].request.method = POST;
      pipelineTestCases::PIPELINE_TESTS[3].request.path.content.ptr = "/foo";
      pipelineTestCases::PIPELINE_TESTS[3].request.path.content.size_ = 5;
      pipelineTestCases::PIPELINE_TESTS[3].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[3].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_2e8.ptr = (HeaderTestCase *)0x0;
      local_2e8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[3].request.requestBodySize.ptr.isSet = false;
      pipelineTestCases::PIPELINE_TESTS[3].request.requestBodyParts.super_Array<kj::StringPtr>.size_
           = 0;
      pipelineTestCases::PIPELINE_TESTS[3].request.requestBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_128.ptr = (StringPtr *)0x0;
      local_128.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[3].request.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[3].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_308.size_ = 0;
      local_308.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_308.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[3].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
           = (StringPtr *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_148.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[3].response.raw.content.ptr =
           "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\n\r\n0\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[3].response.raw.content.size_ = 0x35;
      pipelineTestCases::PIPELINE_TESTS[3].response.statusCode = 200;
      pipelineTestCases::PIPELINE_TESTS[3].response.statusText.content.ptr = "OK";
      pipelineTestCases::PIPELINE_TESTS[3].response.statusText.content.size_ = 3;
      pipelineTestCases::PIPELINE_TESTS[3].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[3].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_308.ptr = (HeaderTestCase *)0x0;
      local_308.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[3].response.responseBodySize.ptr.isSet = false;
      pipelineTestCases::PIPELINE_TESTS[3].response.responseBodyParts.super_Array<kj::StringPtr>.
      size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[3].response.responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_148.ptr = (StringPtr *)0x0;
      local_148.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[3].response.method = GET;
      pipelineTestCases::PIPELINE_TESTS[3].response.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[3].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_328.size_ = 0;
      local_328.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_328.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((pipelineTestCases::PIPELINE_TESTS[4].request.requestBodyParts.super_Array<kj::StringPtr>.ptr
       )->content).ptr = "garply";
      ((pipelineTestCases::PIPELINE_TESTS[4].request.requestBodyParts.super_Array<kj::StringPtr>.ptr
       )->content).size_ = 7;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestBodyParts.super_Array<kj::StringPtr>.ptr
      [1].content.ptr = "waldo";
      pipelineTestCases::PIPELINE_TESTS[4].request.requestBodyParts.super_Array<kj::StringPtr>.ptr
      [1].content.size_ = 6;
      local_168.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[4].request.raw.content.ptr =
           "POST /bar HTTP/1.1\r\nTransfer-Encoding: chunked\r\n\r\n6\r\ngarply\r\n5\r\nwaldo\r\n0\r\n\r\n"
      ;
      pipelineTestCases::PIPELINE_TESTS[4].request.raw.content.size_ = 0x4d;
      pipelineTestCases::PIPELINE_TESTS[4].request.method = POST;
      pipelineTestCases::PIPELINE_TESTS[4].request.path.content.ptr = "/bar";
      pipelineTestCases::PIPELINE_TESTS[4].request.path.content.size_ = 5;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_328.ptr = (HeaderTestCase *)0x0;
      local_328.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestBodySize.ptr.isSet = false;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestBodyParts.super_Array<kj::StringPtr>.size_
           = 2;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_168.ptr = (StringPtr *)0x0;
      local_168.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[4].request.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[4].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_348.size_ = 0;
      local_348.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_348.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
           = (StringPtr *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((pipelineTestCases::PIPELINE_TESTS[4].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).ptr = "fred";
      ((pipelineTestCases::PIPELINE_TESTS[4].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).size_ = 5;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
      [1].content.ptr = "plugh";
      pipelineTestCases::PIPELINE_TESTS[4].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
      [1].content.size_ = 6;
      local_188.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[4].response.raw.content.ptr =
           "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\n\r\n4\r\nfred\r\n5\r\nplugh\r\n0\r\n\r\n"
      ;
      pipelineTestCases::PIPELINE_TESTS[4].response.raw.content.size_ = 0x48;
      pipelineTestCases::PIPELINE_TESTS[4].response.statusCode = 200;
      pipelineTestCases::PIPELINE_TESTS[4].response.statusText.content.ptr = "OK";
      pipelineTestCases::PIPELINE_TESTS[4].response.statusText.content.size_ = 3;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_348.ptr = (HeaderTestCase *)0x0;
      local_348.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseBodySize.ptr.isSet = false;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseBodyParts.super_Array<kj::StringPtr>.
      size_ = 2;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_188.ptr = (StringPtr *)0x0;
      local_188.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[4].response.method = GET;
      pipelineTestCases::PIPELINE_TESTS[4].response.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[4].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_368.size_ = 0;
      local_368.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_368.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_1a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[5].request.raw.content.ptr = "HEAD / HTTP/1.1\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[5].request.raw.content.size_ = 0x14;
      pipelineTestCases::PIPELINE_TESTS[5].request.method = HEAD;
      pipelineTestCases::PIPELINE_TESTS[5].request.path.content.ptr = "/";
      pipelineTestCases::PIPELINE_TESTS[5].request.path.content.size_ = 2;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_368.ptr = (HeaderTestCase *)0x0;
      local_368.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestBodySize.ptr.field_1.value = 0;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestBodyParts.super_Array<kj::StringPtr>.size_
           = 0;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1a8.ptr = (StringPtr *)0x0;
      local_1a8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[5].request.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[5].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_388.size_ = 0;
      local_388.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_388.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
           = (StringPtr *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((pipelineTestCases::PIPELINE_TESTS[5].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).ptr = "foo bar";
      ((pipelineTestCases::PIPELINE_TESTS[5].response.responseBodyParts.super_Array<kj::StringPtr>.
       ptr)->content).size_ = 8;
      local_1c8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[5].response.raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: 7\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[5].response.raw.content.size_ = 0x27;
      pipelineTestCases::PIPELINE_TESTS[5].response.statusCode = 200;
      pipelineTestCases::PIPELINE_TESTS[5].response.statusText.content.ptr = "OK";
      pipelineTestCases::PIPELINE_TESTS[5].response.statusText.content.size_ = 3;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_388.ptr = (HeaderTestCase *)0x0;
      local_388.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseBodySize.ptr.field_1.value = 7;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseBodyParts.super_Array<kj::StringPtr>.
      size_ = 1;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1c8.ptr = (StringPtr *)0x0;
      local_1c8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[5].response.method = GET;
      pipelineTestCases::PIPELINE_TESTS[5].response.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[5].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_3a8.size_ = 0;
      local_3a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_3a8.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_1e8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[6].request.raw.content.ptr = "HEAD / HTTP/1.1\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[6].request.raw.content.size_ = 0x14;
      pipelineTestCases::PIPELINE_TESTS[6].request.method = HEAD;
      pipelineTestCases::PIPELINE_TESTS[6].request.path.content.ptr = "/";
      pipelineTestCases::PIPELINE_TESTS[6].request.path.content.size_ = 2;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_3a8.ptr = (HeaderTestCase *)0x0;
      local_3a8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestBodySize.ptr.field_1.value = 0;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestBodyParts.super_Array<kj::StringPtr>.size_
           = 0;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1e8.ptr = (StringPtr *)0x0;
      local_1e8.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[6].request.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[6].request.requestHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_208.size_ = 0;
      local_208.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_208.ptr = pHVar2;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseBodyParts.super_Array<kj::StringPtr>.ptr
           = (StringPtr *)
             _::HeapArrayDisposer::allocateImpl
                       (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pipelineTestCases::PIPELINE_TESTS[6].response.raw.content.ptr = "HTTP/1.1 200 OK\r\n\r\n";
      pipelineTestCases::PIPELINE_TESTS[6].response.raw.content.size_ = 0x14;
      pipelineTestCases::PIPELINE_TESTS[6].response.statusCode = 200;
      pipelineTestCases::PIPELINE_TESTS[6].response.statusText.content.ptr = "OK";
      pipelineTestCases::PIPELINE_TESTS[6].response.statusText.content.size_ = 3;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_208.ptr = (HeaderTestCase *)0x0;
      local_208.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseBodySize.ptr.isSet = true;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseBodySize.ptr.field_1.value = 0;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseBodyParts.super_Array<kj::StringPtr>.
      size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_48.ptr = (StringPtr *)0x0;
      local_48.size_ = 0;
      pipelineTestCases::PIPELINE_TESTS[6].response.method = HEAD;
      pipelineTestCases::PIPELINE_TESTS[6].response.side = BOTH;
      pipelineTestCases::PIPELINE_TESTS[6].response.responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      Array<kj::StringPtr>::~Array(&local_48);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_208);
      Array<kj::StringPtr>::~Array(&local_1e8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_3a8);
      Array<kj::StringPtr>::~Array(&local_1c8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_388);
      Array<kj::StringPtr>::~Array(&local_1a8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_368);
      Array<kj::StringPtr>::~Array(&local_188);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_348);
      Array<kj::StringPtr>::~Array(&local_168);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_328);
      Array<kj::StringPtr>::~Array(&local_148);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_308);
      Array<kj::StringPtr>::~Array(&local_128);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_2e8);
      Array<kj::StringPtr>::~Array(&local_108);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_2c8);
      Array<kj::StringPtr>::~Array(&local_e8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_2a8);
      Array<kj::StringPtr>::~Array(&local_c8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_288);
      Array<kj::StringPtr>::~Array(&local_a8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_268);
      Array<kj::StringPtr>::~Array(&local_88);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_248);
      Array<kj::StringPtr>::~Array(&local_68);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_228);
      __cxa_atexit(__cxx_global_array_dtor_548,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS);
    }
  }
  AVar3.size_ = 7;
  AVar3.ptr = pipelineTestCases::PIPELINE_TESTS;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const HttpTestCase> pipelineTestCases() {
  static const HttpTestCase PIPELINE_TESTS[] = {
    {
      {
        "GET / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::GET, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 7\r\n"
        "\r\n"
        "foo bar",

        200, "OK", {}, 7, { "foo bar" }
      },
    },

    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Content-Length: 6\r\n"
        "\r\n"
        "grault",

        HttpMethod::POST, "/foo", {}, 6, { "grault" },
      },
      {
        "HTTP/1.1 404 Not Found\r\n"
        "Content-Length: 13\r\n"
        "\r\n"
        "baz qux corge",

        404, "Not Found", {}, 13, { "baz qux corge" }
      },
    },

    // Throw a zero-size request/response into the pipeline to check for a bug that existed with
    // them previously.
    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Content-Length: 0\r\n"
        "\r\n",

        HttpMethod::POST, "/foo", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 0\r\n"
        "\r\n",

        200, "OK", {}, uint64_t(0), {}
      },
    },

    // Also a zero-size chunked request/response.
    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "0\r\n"
        "\r\n",

        HttpMethod::POST, "/foo", {}, nullptr, {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "0\r\n"
        "\r\n",

        200, "OK", {}, nullptr, {}
      },
    },

    {
      {
        "POST /bar HTTP/1.1\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "6\r\n"
        "garply\r\n"
        "5\r\n"
        "waldo\r\n"
        "0\r\n"
        "\r\n",

        HttpMethod::POST, "/bar", {}, nullptr, { "garply", "waldo" },
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "4\r\n"
        "fred\r\n"
        "5\r\n"
        "plugh\r\n"
        "0\r\n"
        "\r\n",

        200, "OK", {}, nullptr, { "fred", "plugh" }
      },
    },

    {
      {
        "HEAD / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::HEAD, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 7\r\n"
        "\r\n",

        200, "OK", {}, 7, { "foo bar" }
      },
    },

    // Zero-length expected size response to HEAD request has no Content-Length header.
    {
      {
        "HEAD / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::HEAD, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "\r\n",

        200, "OK", {}, uint64_t(0), {}, HttpMethod::HEAD,
      },
    },
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents RESPONSE_TEST_CASES from implicitly
  //   casting to our return type.
  return kj::arrayPtr(PIPELINE_TESTS, kj::size(PIPELINE_TESTS));
}